

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath __thiscall
testing::internal::FilePath::ConcatPaths(FilePath *this,FilePath *directory,FilePath *relative_path)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  FilePath FVar3;
  String SStack_38;
  FilePath dir;
  
  pcVar1 = (directory->pathname_).c_str_;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    String::String(&this->pathname_,&relative_path->pathname_);
    sVar2 = extraout_RDX_00;
  }
  else {
    RemoveTrailingPathSeparator(&dir);
    String::Format((char *)&SStack_38,"%s%c%s",dir.pathname_.c_str_,0x2f,
                   (relative_path->pathname_).c_str_);
    FilePath(this,&SStack_38);
    String::~String(&SStack_38);
    String::~String(&dir.pathname_);
    sVar2 = extraout_RDX;
  }
  FVar3.pathname_.length_ = sVar2;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(String::Format("%s%c%s", dir.c_str(), kPathSeparator,
                                 relative_path.c_str()));
}